

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<uInputPlus::uInputAbsSetup> __l_01;
  initializer_list<int> __l_02;
  uInput myinput;
  uInputSetup mysetup;
  allocator_type local_62b;
  less<int> local_62a;
  allocator_type local_629;
  allocator_type local_628;
  less<int> local_627;
  allocator_type local_626;
  less<int> local_625;
  int local_624;
  vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_> local_620;
  string local_608;
  int local_5e8 [2];
  uInputAbsSetup local_5e0;
  undefined2 local_588 [2];
  undefined8 local_584;
  undefined8 uStack_57c;
  undefined4 local_574;
  undefined4 local_570 [2];
  undefined2 *local_568;
  undefined8 *local_560;
  long local_558;
  undefined8 *local_550;
  undefined4 *local_548;
  long local_540;
  undefined4 *local_538;
  undefined2 local_530 [2];
  undefined8 local_52c;
  undefined8 uStack_524;
  undefined8 local_51c;
  undefined2 *local_510;
  undefined8 *local_508;
  long local_500;
  undefined8 *local_4f8;
  long local_4f0;
  long local_4e8;
  undefined8 *local_4e0;
  undefined2 local_4d8 [2];
  undefined8 local_4d4;
  undefined8 uStack_4cc;
  undefined8 local_4c4;
  undefined2 *local_4b8;
  undefined8 *local_4b0;
  long local_4a8;
  undefined8 *local_4a0;
  long local_498;
  long local_490;
  undefined8 *local_488;
  undefined2 local_480 [2];
  undefined8 local_47c;
  undefined8 uStack_474;
  undefined8 local_46c;
  undefined2 *local_460;
  undefined8 *local_458;
  long local_450;
  undefined8 *local_448;
  long local_440;
  long local_438;
  undefined8 *local_430;
  undefined2 local_428 [2];
  undefined8 local_424;
  undefined8 uStack_41c;
  undefined4 local_414;
  undefined4 local_410 [2];
  undefined2 *local_408;
  undefined8 *local_400;
  long local_3f8;
  undefined8 *local_3f0;
  undefined4 *local_3e8;
  long local_3e0;
  undefined4 *local_3d8;
  undefined2 local_3d0 [2];
  undefined8 local_3cc;
  undefined8 uStack_3c4;
  undefined4 local_3bc;
  undefined4 local_3b8 [2];
  undefined2 *local_3b0;
  undefined8 *local_3a8;
  long local_3a0;
  undefined8 *local_398;
  undefined4 *local_390;
  long local_388;
  undefined4 *local_380;
  undefined2 local_378 [2];
  undefined8 local_374;
  undefined8 uStack_36c;
  undefined8 local_364;
  undefined2 *local_358;
  undefined8 *local_350;
  long local_348;
  undefined8 *local_340;
  long local_338;
  long local_330;
  undefined8 *local_328;
  undefined2 local_320 [2];
  undefined8 local_31c;
  undefined8 uStack_314;
  undefined8 local_30c;
  undefined2 *local_300;
  undefined8 *local_2f8;
  long local_2f0;
  undefined8 *local_2e8;
  long local_2e0;
  long local_2d8;
  undefined8 *local_2d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_298;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_268;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_238;
  int local_208 [8];
  uInputSetup local_1e8;
  uInputDeviceInfo local_90;
  
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_608,anon_var_dwarf_4336,anon_var_dwarf_4336 + 3);
  uInputPlus::uInputDeviceInfo::uInputDeviceInfo(&local_90,&local_608,3,0x2333,0x6666,0x5b25);
  local_5e8[0] = 1;
  local_5e8[1] = 3;
  __l._M_len = 2;
  __l._M_array = local_5e8;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_268,__l,&local_625,&local_626)
  ;
  local_208[4] = 0x14a;
  local_208[5] = 0x14d;
  local_208[6] = 0x14e;
  local_208[7] = 0x14f;
  local_208[0] = 0x110;
  local_208[1] = 0x111;
  local_208[2] = 0x145;
  local_208[3] = 0x148;
  __l_00._M_len = 8;
  __l_00._M_array = local_208;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_298,__l_00,&local_627,
             &local_628);
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c8._M_impl.super__Rb_tree_header._M_header;
  local_2c8._M_impl._0_8_ = 0;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5e0.Value = &local_5e0.setup.absinfo.value;
  local_5e0.setup.absinfo.value = 0;
  local_5e0.setup.absinfo.minimum = 0;
  local_5e0.setup.absinfo.flat = 0;
  local_5e0.setup.absinfo.resolution = 0x28;
  local_5e0.Code = (uint16_t *)&local_5e0;
  local_5e0.Min = &local_5e0.setup.absinfo.minimum;
  local_5e0.Max = &local_5e0.setup.absinfo.maximum;
  local_5e0.Resoltion = &local_5e0.setup.absinfo.resolution;
  local_5e0.Fuzz = &local_5e0.setup.absinfo.fuzz;
  local_5e0.Flat = &local_5e0.setup.absinfo.flat;
  local_5e0.setup.code = 0;
  local_5e0.setup.absinfo.maximum = 6000;
  local_5e0.setup.absinfo.fuzz = 0;
  local_568 = local_588;
  local_560 = &local_584;
  local_584 = 0;
  local_574 = 0;
  local_558 = (long)&local_584 + 4;
  local_550 = &uStack_57c;
  local_548 = local_570;
  local_540 = (long)&uStack_57c + 4;
  local_538 = &local_574;
  local_588[0] = 1;
  uStack_57c = 6000;
  local_570[0] = 0x28;
  local_510 = local_530;
  local_508 = &local_52c;
  local_52c = 0;
  local_51c = 0;
  local_500 = (long)&local_52c + 4;
  local_4f8 = &uStack_524;
  local_4f0 = (long)&local_51c + 4;
  local_4e8 = (long)&uStack_524 + 4;
  local_4e0 = &local_51c;
  local_530[0] = 0x18;
  uStack_524 = 0xff;
  local_4b8 = local_4d8;
  local_4b0 = &local_4d4;
  local_4d4 = 0;
  local_4c4 = 0;
  local_4a8 = (long)&local_4d4 + 4;
  local_4a0 = &uStack_4cc;
  local_498 = (long)&local_4c4 + 4;
  local_490 = (long)&uStack_4cc + 4;
  local_488 = &local_4c4;
  local_4d8[0] = 0x1c;
  uStack_4cc = 0xf;
  local_460 = local_480;
  local_458 = &local_47c;
  local_46c = 0;
  local_47c = 0;
  local_450 = (long)&local_47c + 4;
  local_448 = &uStack_474;
  local_440 = (long)&local_46c + 4;
  local_438 = (long)&uStack_474 + 4;
  local_430 = &local_46c;
  local_480[0] = 0x2f;
  uStack_474 = 1;
  local_408 = local_428;
  local_400 = &local_424;
  local_414 = 0;
  local_424 = 0;
  local_3f8 = (long)&local_424 + 4;
  local_3f0 = &uStack_41c;
  local_3e8 = local_410;
  local_3e0 = (long)&uStack_41c + 4;
  local_3d8 = &local_414;
  local_428[0] = 0x35;
  uStack_41c = 6000;
  local_410[0] = 0x28;
  local_3b0 = local_3d0;
  local_3a8 = &local_3cc;
  local_3bc = 0;
  local_3cc = 0;
  local_3a0 = (long)&local_3cc + 4;
  local_398 = &uStack_3c4;
  local_390 = local_3b8;
  local_388 = (long)&uStack_3c4 + 4;
  local_380 = &local_3bc;
  local_3d0[0] = 0x36;
  uStack_3c4 = 6000;
  local_3b8[0] = 0x28;
  local_358 = local_378;
  local_350 = &local_374;
  local_364 = 0;
  local_374 = 0;
  local_348 = (long)&local_374 + 4;
  local_340 = &uStack_36c;
  local_338 = (long)&local_364 + 4;
  local_330 = (long)&uStack_36c + 4;
  local_328 = &local_364;
  local_378[0] = 0x39;
  uStack_36c = 0xffff;
  local_300 = local_320;
  local_2f8 = &local_31c;
  local_30c = 0;
  local_31c = 0;
  local_2f0 = (long)&local_31c + 4;
  local_2e8 = &uStack_314;
  local_2e0 = (long)&local_30c + 4;
  local_2d8 = (long)&uStack_314 + 4;
  local_2d0 = &local_30c;
  local_320[0] = 0x3a;
  uStack_314 = 0xff;
  __l_01._M_len = 9;
  __l_01._M_array = (iterator)local_5e0.Code;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>::vector
            (&local_620,__l_01,&local_629);
  local_624 = 0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_624;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_238,__l_02,&local_62a,
             &local_62b);
  uInputPlus::uInputSetup::uInputSetup
            (&local_1e8,&local_90,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_268,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_298,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_2c8,&local_620,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_238);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_238);
  if (local_620.
      super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_620.
                    super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_298);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  uInputPlus::uInput::uInput((uInput *)&local_5e0,&local_1e8);
  sleep(10);
  uInputPlus::uInput::emulate_touchpad_scroll((uInput *)&local_5e0,-4000,true);
  uInputPlus::uInput::~uInput((uInput *)&local_5e0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1e8.Props._M_t);
  if (local_1e8.AbsSetup.
      super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.AbsSetup.
                    super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1e8.Rels._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1e8.Keys._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1e8.Events._M_t);
  return 0;
}

Assistant:

int main() {

	uInputSetup mysetup(
		{"呀"},
		{EV_KEY, EV_ABS},
		{BTN_LEFT, BTN_RIGHT, BTN_TOOL_FINGER, BTN_TOOL_QUINTTAP, BTN_TOUCH, BTN_TOOL_DOUBLETAP, BTN_TOOL_TRIPLETAP, BTN_TOOL_QUADTAP},
		{},
		{
			{ABS_X, 6000, 40},
			{ABS_Y, 6000, 40},
			{ABS_PRESSURE, 255},
			{ABS_TOOL_WIDTH, 15},
			{ABS_MT_SLOT, 1},
			{ABS_MT_POSITION_X, 6000, 40},
			{ABS_MT_POSITION_Y, 6000, 40},
			{ABS_MT_TRACKING_ID, 65535},
			{ABS_MT_PRESSURE, 255}
		},
		{INPUT_PROP_POINTER}
	);

	uInput myinput(mysetup);

	sleep(10);

//	myinput.SendKeyPress({KEY_2, KEY_3, KEY_3, KEY_6, KEY_6, KEY_6});
//	myinput.SendKeyPress({{KEY_1, 1000}, {KEY_2, 600}});


	myinput.emulate_touchpad_scroll(-4000);
//	int i = 600;
//
//	while (i--) {
////		myinput.RelativeWheel(1);
//		myinput.AbsoluteWheel(1);
//		//myinput.RelativeMove({10, 10});
//		usleep(1000*16);
//	}


}